

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O1

Optimal * optimize(uchar *input_data,size_t input_size)

{
  long *plVar1;
  Optimal *pOVar2;
  uchar *puVar3;
  long *plVar4;
  long lVar5;
  bool bVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *__ptr;
  Optimal *pOVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uchar uVar15;
  int iVar17;
  long lVar18;
  long *plVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  size_t sVar16;
  
  pvVar7 = calloc(0x881,8);
  pvVar8 = calloc(0x881,8);
  pvVar9 = calloc(0x10000,0x10);
  __ptr = calloc(input_size,0x10);
  sVar16 = input_size;
  pOVar10 = (Optimal *)calloc(input_size,0x10);
  uVar15 = (uchar)sVar16;
  if ((((pvVar7 == (void *)0x0) || (pvVar8 == (void *)0x0)) || (pvVar9 == (void *)0x0)) ||
     ((__ptr == (void *)0x0 || (pOVar10 == (Optimal *)0x0)))) {
    optimize_cold_1();
    pOVar10 = (Optimal *)output_data;
    puVar3 = output_data + output_index;
    output_index = output_index + 1;
    *puVar3 = uVar15;
    return pOVar10;
  }
  pOVar10->bits = 8;
  if (1 < input_size) {
    uVar11 = 1;
    do {
      lVar14 = uVar11 * 0x10;
      pOVar10[uVar11].bits = pOVar10[uVar11 - 1].bits + 9;
      lVar18 = (ulong)(ushort)(*(ushort *)(input_data + (uVar11 - 1)) << 8 |
                              *(ushort *)(input_data + (uVar11 - 1)) >> 8) * 0x10;
      plVar1 = (long *)((long)pvVar9 + lVar18);
      plVar4 = *(long **)((long)pvVar9 + lVar18 + 8);
      if (plVar4 != (long *)0x0) {
        lVar18 = uVar11 - *plVar4;
        plVar19 = plVar1;
        if ((int)lVar18 < 0x881) {
          pOVar2 = pOVar10 + uVar11;
          uVar22 = 1;
          do {
            plVar19 = plVar4;
            iVar17 = (int)lVar18;
            lVar18 = (long)iVar17;
            uVar20 = 2;
            do {
              if (uVar22 < uVar20) {
                iVar21 = 1;
                if (2 < uVar20) {
                  uVar13 = (int)uVar20 - 1;
                  do {
                    iVar21 = iVar21 + 2;
                    bVar6 = 3 < uVar13;
                    uVar13 = uVar13 >> 1;
                  } while (bVar6);
                }
                uVar12 = (long)(int)(iVar21 + (uint)(0x80 < iVar17) * 4 + 9) +
                         pOVar10[uVar11 - uVar20].bits;
                uVar22 = uVar20;
                if (uVar12 < pOVar2->bits) {
                  pOVar2->bits = uVar12;
                  pOVar2->offset = iVar17;
                  pOVar2->len = (int)uVar20;
                }
              }
              else {
                lVar5 = *(long *)((long)pvVar8 + lVar18 * 8);
                if (((lVar5 != 0) && (uVar11 + 1 == lVar5 + uVar20)) &&
                   (uVar20 = uVar11 - *(long *)((long)pvVar7 + lVar18 * 8), uVar22 <= uVar20)) {
                  uVar20 = uVar22;
                }
              }
            } while (((uVar20 + lVar18 <= uVar11) &&
                     (input_data[uVar11 - uVar20] == input_data[(uVar11 - uVar20) - lVar18])) &&
                    (uVar20 = uVar20 + 1, uVar20 < 0x10001));
            *(ulong *)((long)pvVar7 + (long)iVar17 * 8) = (uVar11 + 1) - uVar20;
            *(ulong *)((long)pvVar8 + (long)iVar17 * 8) = uVar11;
            plVar4 = (long *)plVar19[1];
            if ((plVar4 == (long *)0x0) || (0xffff < uVar22)) goto LAB_00105f91;
            lVar18 = uVar11 - *plVar4;
          } while ((int)lVar18 < 0x881);
        }
        plVar19[1] = 0;
      }
LAB_00105f91:
      *(ulong *)((long)__ptr + lVar14) = uVar11;
      *(long *)((long)__ptr + lVar14 + 8) = plVar1[1];
      plVar1[1] = (long)((long)__ptr + lVar14);
      uVar11 = uVar11 + 1;
    } while (uVar11 != input_size);
  }
  free(__ptr);
  return pOVar10;
}

Assistant:

Optimal* optimize(unsigned char *input_data, size_t input_size) {
    size_t *min;
    size_t *max;
    Match *matches;
    Match *match_slots;
    Optimal *optimal;
    Match *match;
    int match_index;
    int offset;
    size_t len;
    size_t best_len;
    size_t bits;
    size_t i;

    /* allocate all data structures at once */
    min = (size_t *)calloc(ZX7_MAX_OFFSET+1, sizeof(size_t));
    max = (size_t *)calloc(ZX7_MAX_OFFSET+1, sizeof(size_t));
    matches = (Match *)calloc(256*256, sizeof(Match));
    match_slots = (Match *)calloc(input_size, sizeof(Match));
    optimal = (Optimal *)calloc(input_size, sizeof(Optimal));

    if (!min || !max || !matches || !match_slots || !optimal) {
         fprintf(stderr, "Error: Insufficient memory\n");
         exit(1);
    }

    /* first byte is always literal */
    optimal[0].bits = 8;

    /* process remaining bytes */
    for (i = 1; i < input_size; i++) {

        optimal[i].bits = optimal[i-1].bits + 9;
        match_index = input_data[i-1] << 8 | input_data[i];
        best_len = 1;
        for (match = &matches[match_index]; match->next != NULL && best_len < ZX7_MAX_LEN; match = match->next) {
            offset = i - match->next->index;
            if (offset > ZX7_MAX_OFFSET) {
                match->next = NULL;
                break;
            }

            for (len = 2; len <= ZX7_MAX_LEN; len++) {
                if (len > best_len) {
                    best_len = len;
                    bits = optimal[i-len].bits + count_bits(offset, len);
                    if (optimal[i].bits > bits) {
                        optimal[i].bits = bits;
                        optimal[i].offset = offset;
                        optimal[i].len = len;
                    }
                } else if (i+1 == max[offset]+len && max[offset] != 0) {
                    len = i-min[offset];
                    if (len > best_len) {
                        len = best_len;
                    }
                }
                if (i < offset+len || input_data[i-len] != input_data[i-len-offset]) {
                    break;
                }
            }
            min[offset] = i+1-len;
            max[offset] = i;
        }
        match_slots[i].index = i;
        match_slots[i].next = matches[match_index].next;
        matches[match_index].next = &match_slots[i];
    }

    /* save time by releasing the largest block only, the O.S. will clean everything else later */
    free(match_slots);

    return optimal;
}